

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMvIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Scene *pSVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  byte bVar33;
  int iVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  uint uVar39;
  ulong uVar40;
  long lVar41;
  ulong *puVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  vint4 bi;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  vint4 ai;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  float fVar60;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar61 [64];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  uint uVar69;
  uint uVar70;
  uint uVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar68 [64];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong *local_d30;
  RTCFilterFunctionNArguments local_cd0;
  undefined1 local_ca0 [32];
  undefined1 local_c80 [16];
  undefined1 local_c70 [16];
  undefined1 local_c60 [16];
  undefined1 local_c50 [16];
  undefined1 local_c40 [16];
  undefined1 local_c30 [16];
  undefined1 local_c20 [16];
  undefined1 local_c10 [16];
  undefined1 local_c00 [32];
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [32];
  undefined4 local_b80;
  undefined4 uStack_b7c;
  undefined4 uStack_b78;
  undefined4 uStack_b74;
  undefined4 uStack_b70;
  undefined4 uStack_b6c;
  undefined4 uStack_b68;
  undefined4 uStack_b64;
  undefined4 local_b60;
  undefined4 uStack_b5c;
  undefined4 uStack_b58;
  undefined4 uStack_b54;
  undefined4 uStack_b50;
  undefined4 uStack_b4c;
  undefined4 uStack_b48;
  undefined4 uStack_b44;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  float local_9c0 [4];
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar86 = ZEXT1664(CONCAT412(fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))));
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_c10._4_4_ = fVar3;
  local_c10._0_4_ = fVar3;
  local_c10._8_4_ = fVar3;
  local_c10._12_4_ = fVar3;
  auVar55 = ZEXT1664(local_c10);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar72 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_c20._4_4_ = fVar72;
  local_c20._0_4_ = fVar72;
  local_c20._8_4_ = fVar72;
  local_c20._12_4_ = fVar72;
  auVar57 = ZEXT1664(local_c20);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar72 = fVar72 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_c30._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_c30._8_4_ = -fVar2;
  local_c30._12_4_ = -fVar2;
  auVar59 = ZEXT1664(local_c30);
  local_c40._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  local_c40._8_4_ = -fVar3;
  local_c40._12_4_ = -fVar3;
  auVar61 = ZEXT1664(local_c40);
  local_c50._0_8_ = CONCAT44(fVar72,fVar72) ^ 0x8000000080000000;
  local_c50._8_4_ = -fVar72;
  local_c50._12_4_ = -fVar72;
  auVar54 = ZEXT1664(local_c50);
  iVar34 = (tray->tnear).field_0.i[k];
  local_c60._4_4_ = iVar34;
  local_c60._0_4_ = iVar34;
  local_c60._8_4_ = iVar34;
  local_c60._12_4_ = iVar34;
  auVar67 = ZEXT1664(local_c60);
  iVar34 = (tray->tfar).field_0.i[k];
  local_c70._4_4_ = iVar34;
  local_c70._0_4_ = iVar34;
  local_c70._8_4_ = iVar34;
  local_c70._12_4_ = iVar34;
  auVar68 = ZEXT1664(local_c70);
  local_ba0._16_16_ = mm_lookupmask_ps._240_16_;
  local_ba0._0_16_ = mm_lookupmask_ps._0_16_;
  iVar34 = 1 << ((uint)k & 0x1f);
  auVar66._4_4_ = iVar34;
  auVar66._0_4_ = iVar34;
  auVar66._8_4_ = iVar34;
  auVar66._12_4_ = iVar34;
  auVar66._16_4_ = iVar34;
  auVar66._20_4_ = iVar34;
  auVar66._24_4_ = iVar34;
  auVar66._28_4_ = iVar34;
  auVar47 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar66 = vpand_avx2(auVar66,auVar47);
  local_be0 = vpcmpeqd_avx2(auVar66,auVar47);
  local_b60 = 0x7fffffff;
  uStack_b5c = 0x7fffffff;
  uStack_b58 = 0x7fffffff;
  uStack_b54 = 0x7fffffff;
  uStack_b50 = 0x7fffffff;
  uStack_b4c = 0x7fffffff;
  uStack_b48 = 0x7fffffff;
  uStack_b44 = 0x7fffffff;
  local_b80 = 0x80000000;
  uStack_b7c = 0x80000000;
  uStack_b78 = 0x80000000;
  uStack_b74 = 0x80000000;
  uStack_b70 = 0x80000000;
  uStack_b6c = 0x80000000;
  uStack_b68 = 0x80000000;
  uStack_b64 = 0x80000000;
  auVar49._8_4_ = 0x3f800000;
  auVar49._0_8_ = 0x3f8000003f800000;
  auVar49._12_4_ = 0x3f800000;
  auVar49._16_4_ = 0x3f800000;
  auVar49._20_4_ = 0x3f800000;
  auVar49._24_4_ = 0x3f800000;
  auVar49._28_4_ = 0x3f800000;
  auVar47._8_4_ = 0xbf800000;
  auVar47._0_8_ = 0xbf800000bf800000;
  auVar47._12_4_ = 0xbf800000;
  auVar47._16_4_ = 0xbf800000;
  auVar47._20_4_ = 0xbf800000;
  auVar47._24_4_ = 0xbf800000;
  auVar47._28_4_ = 0xbf800000;
  local_bc0 = vblendvps_avx(auVar49,auVar47,local_ba0);
  local_d30 = local_7f8;
LAB_015f8418:
  do {
    puVar42 = local_d30;
    if (puVar42 == &local_800) {
LAB_015f8b7e:
      return puVar42 != &local_800;
    }
    local_d30 = puVar42 + -1;
    uVar37 = puVar42[-1];
    while ((uVar37 & 8) == 0) {
      auVar46 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar43),auVar59._0_16_,
                                auVar86._0_16_);
      auVar17 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar45),auVar61._0_16_,
                                auVar55._0_16_);
      auVar46 = vpmaxsd_avx(auVar46,auVar17);
      auVar17 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar44),auVar54._0_16_,
                                auVar57._0_16_);
      auVar17 = vpmaxsd_avx(auVar17,auVar67._0_16_);
      auVar46 = vpmaxsd_avx(auVar46,auVar17);
      auVar17 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar37 + 0x20 + (uVar43 ^ 0x10)),
                                auVar59._0_16_,auVar86._0_16_);
      auVar18 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar37 + 0x20 + (uVar45 ^ 0x10)),
                                auVar61._0_16_,auVar55._0_16_);
      auVar17 = vpminsd_avx(auVar17,auVar18);
      auVar18 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar37 + 0x20 + (uVar44 ^ 0x10)),
                                auVar54._0_16_,auVar57._0_16_);
      auVar18 = vpminsd_avx(auVar18,auVar68._0_16_);
      auVar17 = vpminsd_avx(auVar17,auVar18);
      auVar46 = vpcmpgtd_avx(auVar46,auVar17);
      iVar34 = vmovmskps_avx(auVar46);
      if (iVar34 == 0xf) goto LAB_015f8418;
      bVar33 = (byte)iVar34 ^ 0xf;
      uVar35 = uVar37 & 0xfffffffffffffff0;
      lVar41 = 0;
      for (uVar37 = (ulong)bVar33; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
        lVar41 = lVar41 + 1;
      }
      uVar37 = *(ulong *)(uVar35 + lVar41 * 8);
      uVar39 = bVar33 - 1 & (uint)bVar33;
      uVar40 = (ulong)uVar39;
      if (uVar39 != 0) {
        do {
          *local_d30 = uVar37;
          local_d30 = local_d30 + 1;
          lVar41 = 0;
          for (uVar37 = uVar40; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
            lVar41 = lVar41 + 1;
          }
          uVar40 = uVar40 - 1 & uVar40;
          uVar37 = *(ulong *)(uVar35 + lVar41 * 8);
        } while (uVar40 != 0);
      }
    }
    uVar35 = uVar37 & 0xfffffffffffffff0;
    for (lVar41 = 0; lVar41 != (ulong)((uint)uVar37 & 0xf) - 8; lVar41 = lVar41 + 1) {
      lVar36 = lVar41 * 0xe0;
      lVar1 = uVar35 + 0xd0 + lVar36;
      local_b40 = *(undefined8 *)(lVar1 + 0x10);
      uStack_b38 = *(undefined8 *)(lVar1 + 0x18);
      lVar1 = uVar35 + 0xc0 + lVar36;
      local_b20 = *(undefined8 *)(lVar1 + 0x10);
      uStack_b18 = *(undefined8 *)(lVar1 + 0x18);
      uStack_b10 = local_b20;
      uStack_b08 = uStack_b18;
      uStack_b30 = local_b40;
      uStack_b28 = uStack_b38;
      auVar56._16_16_ = *(undefined1 (*) [16])(uVar35 + 0x60 + lVar36);
      auVar56._0_16_ = *(undefined1 (*) [16])(uVar35 + lVar36);
      auVar58._16_16_ = *(undefined1 (*) [16])(uVar35 + 0x70 + lVar36);
      auVar58._0_16_ = *(undefined1 (*) [16])(uVar35 + 0x10 + lVar36);
      auVar65._16_16_ = *(undefined1 (*) [16])(uVar35 + 0x80 + lVar36);
      auVar65._0_16_ = *(undefined1 (*) [16])(uVar35 + 0x20 + lVar36);
      auVar46 = *(undefined1 (*) [16])(uVar35 + 0x30 + lVar36);
      auVar48._16_16_ = auVar46;
      auVar48._0_16_ = auVar46;
      auVar17 = *(undefined1 (*) [16])(uVar35 + 0x40 + lVar36);
      auVar50._16_16_ = auVar17;
      auVar50._0_16_ = auVar17;
      auVar18 = *(undefined1 (*) [16])(uVar35 + 0x50 + lVar36);
      auVar51._16_16_ = auVar18;
      auVar51._0_16_ = auVar18;
      auVar18 = *(undefined1 (*) [16])(uVar35 + 0x90 + lVar36);
      auVar53._16_16_ = auVar18;
      auVar53._0_16_ = auVar18;
      auVar18 = *(undefined1 (*) [16])(uVar35 + 0xa0 + lVar36);
      auVar75._16_16_ = auVar18;
      auVar75._0_16_ = auVar18;
      auVar18 = *(undefined1 (*) [16])(uVar35 + 0xb0 + lVar36);
      auVar78._16_16_ = auVar18;
      auVar78._0_16_ = auVar18;
      auVar47 = vsubps_avx(auVar56,auVar48);
      auVar66 = vsubps_avx(auVar58,auVar50);
      auVar49 = vsubps_avx(auVar65,auVar51);
      auVar11 = vsubps_avx(auVar53,auVar56);
      auVar12 = vsubps_avx(auVar75,auVar58);
      auVar13 = vsubps_avx(auVar78,auVar65);
      auVar14._4_4_ = auVar13._4_4_ * auVar66._4_4_;
      auVar14._0_4_ = auVar13._0_4_ * auVar66._0_4_;
      auVar14._8_4_ = auVar13._8_4_ * auVar66._8_4_;
      auVar14._12_4_ = auVar13._12_4_ * auVar66._12_4_;
      auVar14._16_4_ = auVar13._16_4_ * auVar66._16_4_;
      auVar14._20_4_ = auVar13._20_4_ * auVar66._20_4_;
      auVar14._24_4_ = auVar13._24_4_ * auVar66._24_4_;
      auVar14._28_4_ = auVar46._12_4_;
      auVar19 = vfmsub231ps_fma(auVar14,auVar12,auVar49);
      auVar15._4_4_ = auVar49._4_4_ * auVar11._4_4_;
      auVar15._0_4_ = auVar49._0_4_ * auVar11._0_4_;
      auVar15._8_4_ = auVar49._8_4_ * auVar11._8_4_;
      auVar15._12_4_ = auVar49._12_4_ * auVar11._12_4_;
      auVar15._16_4_ = auVar49._16_4_ * auVar11._16_4_;
      auVar15._20_4_ = auVar49._20_4_ * auVar11._20_4_;
      auVar15._24_4_ = auVar49._24_4_ * auVar11._24_4_;
      auVar15._28_4_ = auVar17._12_4_;
      auVar20 = vfmsub231ps_fma(auVar15,auVar13,auVar47);
      uVar4 = *(undefined4 *)(ray + k * 4);
      auVar80._4_4_ = uVar4;
      auVar80._0_4_ = uVar4;
      auVar80._8_4_ = uVar4;
      auVar80._12_4_ = uVar4;
      auVar80._16_4_ = uVar4;
      auVar80._20_4_ = uVar4;
      auVar80._24_4_ = uVar4;
      auVar80._28_4_ = uVar4;
      uVar4 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar82._4_4_ = uVar4;
      auVar82._0_4_ = uVar4;
      auVar82._8_4_ = uVar4;
      auVar82._12_4_ = uVar4;
      auVar82._16_4_ = uVar4;
      auVar82._20_4_ = uVar4;
      auVar82._24_4_ = uVar4;
      auVar82._28_4_ = uVar4;
      uVar4 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar84._4_4_ = uVar4;
      auVar84._0_4_ = uVar4;
      auVar84._8_4_ = uVar4;
      auVar84._12_4_ = uVar4;
      auVar84._16_4_ = uVar4;
      auVar84._20_4_ = uVar4;
      auVar84._24_4_ = uVar4;
      auVar84._28_4_ = uVar4;
      fVar2 = *(float *)(ray + k * 4 + 0x80);
      auVar76._4_4_ = fVar2;
      auVar76._0_4_ = fVar2;
      auVar76._8_4_ = fVar2;
      auVar76._12_4_ = fVar2;
      auVar76._16_4_ = fVar2;
      auVar76._20_4_ = fVar2;
      auVar76._24_4_ = fVar2;
      auVar76._28_4_ = fVar2;
      auVar14 = vsubps_avx(auVar56,auVar80);
      fVar3 = *(float *)(ray + k * 4 + 0xa0);
      auVar81._4_4_ = fVar3;
      auVar81._0_4_ = fVar3;
      auVar81._8_4_ = fVar3;
      auVar81._12_4_ = fVar3;
      auVar81._16_4_ = fVar3;
      auVar81._20_4_ = fVar3;
      auVar81._24_4_ = fVar3;
      auVar81._28_4_ = fVar3;
      auVar15 = vsubps_avx(auVar58,auVar82);
      fVar72 = *(float *)(ray + k * 4 + 0xc0);
      auVar83._4_4_ = fVar72;
      auVar83._0_4_ = fVar72;
      auVar83._8_4_ = fVar72;
      auVar83._12_4_ = fVar72;
      auVar83._16_4_ = fVar72;
      auVar83._20_4_ = fVar72;
      auVar83._24_4_ = fVar72;
      auVar83._28_4_ = fVar72;
      auVar48 = vsubps_avx(auVar65,auVar84);
      auVar23._4_4_ = fVar2 * auVar15._4_4_;
      auVar23._0_4_ = fVar2 * auVar15._0_4_;
      auVar23._8_4_ = fVar2 * auVar15._8_4_;
      auVar23._12_4_ = fVar2 * auVar15._12_4_;
      auVar23._16_4_ = fVar2 * auVar15._16_4_;
      auVar23._20_4_ = fVar2 * auVar15._20_4_;
      auVar23._24_4_ = fVar2 * auVar15._24_4_;
      auVar23._28_4_ = uVar4;
      auVar46 = vfmsub231ps_fma(auVar23,auVar14,auVar81);
      auVar24._4_4_ = auVar13._4_4_ * auVar46._4_4_;
      auVar24._0_4_ = auVar13._0_4_ * auVar46._0_4_;
      auVar24._8_4_ = auVar13._8_4_ * auVar46._8_4_;
      auVar24._12_4_ = auVar13._12_4_ * auVar46._12_4_;
      auVar24._16_4_ = auVar13._16_4_ * 0.0;
      auVar24._20_4_ = auVar13._20_4_ * 0.0;
      auVar24._24_4_ = auVar13._24_4_ * 0.0;
      auVar24._28_4_ = auVar13._28_4_;
      auVar85._0_4_ = auVar49._0_4_ * auVar46._0_4_;
      auVar85._4_4_ = auVar49._4_4_ * auVar46._4_4_;
      auVar85._8_4_ = auVar49._8_4_ * auVar46._8_4_;
      auVar85._12_4_ = auVar49._12_4_ * auVar46._12_4_;
      auVar85._16_4_ = auVar49._16_4_ * 0.0;
      auVar85._20_4_ = auVar49._20_4_ * 0.0;
      auVar85._24_4_ = auVar49._24_4_ * 0.0;
      auVar85._28_4_ = 0;
      auVar13._4_4_ = fVar72 * auVar14._4_4_;
      auVar13._0_4_ = fVar72 * auVar14._0_4_;
      auVar13._8_4_ = fVar72 * auVar14._8_4_;
      auVar13._12_4_ = fVar72 * auVar14._12_4_;
      auVar13._16_4_ = fVar72 * auVar14._16_4_;
      auVar13._20_4_ = fVar72 * auVar14._20_4_;
      auVar13._24_4_ = fVar72 * auVar14._24_4_;
      auVar13._28_4_ = auVar49._28_4_;
      auVar17 = vfmsub231ps_fma(auVar13,auVar48,auVar76);
      auVar46 = vfmadd231ps_fma(auVar24,ZEXT1632(auVar17),auVar12);
      auVar17 = vfmadd231ps_fma(auVar85,auVar66,ZEXT1632(auVar17));
      auVar25._4_4_ = auVar47._4_4_ * auVar12._4_4_;
      auVar25._0_4_ = auVar47._0_4_ * auVar12._0_4_;
      auVar25._8_4_ = auVar47._8_4_ * auVar12._8_4_;
      auVar25._12_4_ = auVar47._12_4_ * auVar12._12_4_;
      auVar25._16_4_ = auVar47._16_4_ * auVar12._16_4_;
      auVar25._20_4_ = auVar47._20_4_ * auVar12._20_4_;
      auVar25._24_4_ = auVar47._24_4_ * auVar12._24_4_;
      auVar25._28_4_ = auVar12._28_4_;
      auVar21 = vfmsub231ps_fma(auVar25,auVar11,auVar66);
      auVar12._4_4_ = fVar3 * auVar48._4_4_;
      auVar12._0_4_ = fVar3 * auVar48._0_4_;
      auVar12._8_4_ = fVar3 * auVar48._8_4_;
      auVar12._12_4_ = fVar3 * auVar48._12_4_;
      auVar12._16_4_ = fVar3 * auVar48._16_4_;
      auVar12._20_4_ = fVar3 * auVar48._20_4_;
      auVar12._24_4_ = fVar3 * auVar48._24_4_;
      auVar12._28_4_ = auVar66._28_4_;
      auVar22 = vfmsub231ps_fma(auVar12,auVar15,auVar83);
      fVar2 = auVar21._0_4_;
      fVar3 = auVar21._4_4_;
      auVar26._4_4_ = fVar72 * fVar3;
      auVar26._0_4_ = fVar72 * fVar2;
      fVar9 = auVar21._8_4_;
      auVar26._8_4_ = fVar72 * fVar9;
      fVar10 = auVar21._12_4_;
      auVar26._12_4_ = fVar72 * fVar10;
      auVar26._16_4_ = fVar72 * 0.0;
      auVar26._20_4_ = fVar72 * 0.0;
      auVar26._24_4_ = fVar72 * 0.0;
      auVar26._28_4_ = fVar72;
      auVar18 = vfmadd231ps_fma(auVar26,ZEXT1632(auVar20),auVar81);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT1632(auVar19),auVar76);
      auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),ZEXT1632(auVar22),auVar11);
      auVar11._4_4_ = uStack_b7c;
      auVar11._0_4_ = local_b80;
      auVar11._8_4_ = uStack_b78;
      auVar11._12_4_ = uStack_b74;
      auVar11._16_4_ = uStack_b70;
      auVar11._20_4_ = uStack_b6c;
      auVar11._24_4_ = uStack_b68;
      auVar11._28_4_ = uStack_b64;
      auVar66 = vandps_avx(ZEXT1632(auVar18),auVar11);
      uVar39 = auVar66._0_4_;
      local_b00._0_4_ = (float)(uVar39 ^ auVar46._0_4_);
      uVar69 = auVar66._4_4_;
      local_b00._4_4_ = (float)(uVar69 ^ auVar46._4_4_);
      uVar70 = auVar66._8_4_;
      local_b00._8_4_ = (float)(uVar70 ^ auVar46._8_4_);
      uVar71 = auVar66._12_4_;
      local_b00._12_4_ = (float)(uVar71 ^ auVar46._12_4_);
      fVar72 = auVar66._16_4_;
      local_b00._16_4_ = fVar72;
      fVar73 = auVar66._20_4_;
      local_b00._20_4_ = fVar73;
      fVar74 = auVar66._24_4_;
      local_b00._24_4_ = fVar74;
      fStack_9a4 = auVar66._28_4_;
      local_b00._28_4_ = fStack_9a4;
      auVar46 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar47,ZEXT1632(auVar22));
      local_ae0._0_4_ = (float)(uVar39 ^ auVar46._0_4_);
      local_ae0._4_4_ = (float)(uVar69 ^ auVar46._4_4_);
      local_ae0._8_4_ = (float)(uVar70 ^ auVar46._8_4_);
      local_ae0._12_4_ = (float)(uVar71 ^ auVar46._12_4_);
      local_ae0._16_4_ = fVar72;
      local_ae0._20_4_ = fVar73;
      local_ae0._24_4_ = fVar74;
      local_ae0._28_4_ = fStack_9a4;
      auVar66 = vcmpps_avx(local_b00,ZEXT832(0) << 0x20,5);
      auVar47 = vcmpps_avx(local_ae0,ZEXT832(0) << 0x20,5);
      auVar66 = vandps_avx(auVar47,auVar66);
      auVar32._4_4_ = uStack_b5c;
      auVar32._0_4_ = local_b60;
      auVar32._8_4_ = uStack_b58;
      auVar32._12_4_ = uStack_b54;
      auVar32._16_4_ = uStack_b50;
      auVar32._20_4_ = uStack_b4c;
      auVar32._24_4_ = uStack_b48;
      auVar32._28_4_ = uStack_b44;
      local_aa0 = vandps_avx(ZEXT1632(auVar18),auVar32);
      auVar47 = vcmpps_avx(ZEXT1632(auVar18),ZEXT832(0) << 0x20,4);
      auVar66 = vandps_avx(auVar66,auVar47);
      auVar79._0_4_ = local_b00._0_4_ + local_ae0._0_4_;
      auVar79._4_4_ = local_b00._4_4_ + local_ae0._4_4_;
      auVar79._8_4_ = local_b00._8_4_ + local_ae0._8_4_;
      auVar79._12_4_ = local_b00._12_4_ + local_ae0._12_4_;
      auVar79._16_4_ = fVar72 + fVar72;
      auVar79._20_4_ = fVar73 + fVar73;
      auVar79._24_4_ = fVar74 + fVar74;
      auVar79._28_4_ = fStack_9a4 + fStack_9a4;
      auVar47 = vcmpps_avx(auVar79,local_aa0,2);
      auVar49 = auVar47 & auVar66;
      if ((((((((auVar49 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar49 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar49 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar49 >> 0x7f,0) != '\0') ||
            (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar49 >> 0xbf,0) != '\0') ||
          (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar49[0x1f] < '\0') {
        auVar66 = vandps_avx(auVar66,auVar47);
        auVar46 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
        auVar27._4_4_ = auVar48._4_4_ * fVar3;
        auVar27._0_4_ = auVar48._0_4_ * fVar2;
        auVar27._8_4_ = auVar48._8_4_ * fVar9;
        auVar27._12_4_ = auVar48._12_4_ * fVar10;
        auVar27._16_4_ = auVar48._16_4_ * 0.0;
        auVar27._20_4_ = auVar48._20_4_ * 0.0;
        auVar27._24_4_ = auVar48._24_4_ * 0.0;
        auVar27._28_4_ = auVar48._28_4_;
        auVar17 = vfmadd213ps_fma(auVar15,ZEXT1632(auVar20),auVar27);
        auVar17 = vfmadd213ps_fma(auVar14,ZEXT1632(auVar19),ZEXT1632(auVar17));
        local_ac0._0_4_ = (float)(uVar39 ^ auVar17._0_4_);
        local_ac0._4_4_ = (float)(uVar69 ^ auVar17._4_4_);
        local_ac0._8_4_ = (float)(uVar70 ^ auVar17._8_4_);
        local_ac0._12_4_ = (float)(uVar71 ^ auVar17._12_4_);
        local_ac0._16_4_ = fVar72;
        local_ac0._20_4_ = fVar73;
        local_ac0._24_4_ = fVar74;
        local_ac0._28_4_ = fStack_9a4;
        fVar60 = *(float *)(ray + k * 4 + 0x60);
        auVar28._4_4_ = local_aa0._4_4_ * fVar60;
        auVar28._0_4_ = local_aa0._0_4_ * fVar60;
        auVar28._8_4_ = local_aa0._8_4_ * fVar60;
        auVar28._12_4_ = local_aa0._12_4_ * fVar60;
        auVar28._16_4_ = local_aa0._16_4_ * fVar60;
        auVar28._20_4_ = local_aa0._20_4_ * fVar60;
        auVar28._24_4_ = local_aa0._24_4_ * fVar60;
        auVar28._28_4_ = fVar60;
        auVar66 = vcmpps_avx(auVar28,local_ac0,1);
        fVar60 = *(float *)(ray + k * 4 + 0x100);
        auVar54 = ZEXT3264(CONCAT428(fVar60,CONCAT424(fVar60,CONCAT420(fVar60,CONCAT416(fVar60,
                                                  CONCAT412(fVar60,CONCAT48(fVar60,CONCAT44(fVar60,
                                                  fVar60))))))));
        auVar29._4_4_ = fVar60 * local_aa0._4_4_;
        auVar29._0_4_ = fVar60 * local_aa0._0_4_;
        auVar29._8_4_ = fVar60 * local_aa0._8_4_;
        auVar29._12_4_ = fVar60 * local_aa0._12_4_;
        auVar29._16_4_ = fVar60 * local_aa0._16_4_;
        auVar29._20_4_ = fVar60 * local_aa0._20_4_;
        auVar29._24_4_ = fVar60 * local_aa0._24_4_;
        auVar29._28_4_ = auVar48._28_4_;
        auVar47 = vcmpps_avx(local_ac0,auVar29,2);
        auVar66 = vandps_avx(auVar47,auVar66);
        auVar17 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
        auVar46 = vpand_avx(auVar46,auVar17);
        auVar66 = vpmovzxwd_avx2(auVar46);
        auVar66 = vpslld_avx2(auVar66,0x1f);
        if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar66 >> 0x7f,0) != '\0') ||
              (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar66 >> 0xbf,0) != '\0') ||
            (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar66[0x1f] < '\0') {
          local_a20 = vpsrad_avx2(auVar66,0x1f);
          local_a80 = ZEXT1632(auVar19);
          local_a60 = ZEXT1632(auVar20);
          local_a40 = ZEXT1632(auVar21);
          auVar66 = vrcpps_avx(local_aa0);
          local_940 = local_ba0;
          pSVar6 = context->scene;
          auVar77._8_4_ = 0x3f800000;
          auVar77._0_8_ = 0x3f8000003f800000;
          auVar77._12_4_ = 0x3f800000;
          auVar77._16_4_ = 0x3f800000;
          auVar77._20_4_ = 0x3f800000;
          auVar77._24_4_ = 0x3f800000;
          auVar77._28_4_ = 0x3f800000;
          auVar17 = vfnmadd213ps_fma(local_aa0,auVar66,auVar77);
          auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar66,auVar66);
          fVar60 = auVar17._0_4_;
          fVar62 = auVar17._4_4_;
          fVar63 = auVar17._8_4_;
          fVar64 = auVar17._12_4_;
          local_9c0[0] = fVar60 * local_ac0._0_4_;
          local_9c0[1] = fVar62 * local_ac0._4_4_;
          local_9c0[2] = fVar63 * local_ac0._8_4_;
          local_9c0[3] = fVar64 * local_ac0._12_4_;
          fStack_9b0 = fVar72 * 0.0;
          fStack_9ac = fVar73 * 0.0;
          fStack_9a8 = fVar74 * 0.0;
          auVar30._4_4_ = fVar62 * local_b00._4_4_;
          auVar30._0_4_ = fVar60 * local_b00._0_4_;
          auVar30._8_4_ = fVar63 * local_b00._8_4_;
          auVar30._12_4_ = fVar64 * local_b00._12_4_;
          auVar30._16_4_ = fVar72 * 0.0;
          auVar30._20_4_ = fVar73 * 0.0;
          auVar30._24_4_ = fVar74 * 0.0;
          auVar30._28_4_ = fStack_9a4;
          auVar66 = vminps_avx(auVar30,auVar77);
          auVar31._4_4_ = fVar62 * local_ae0._4_4_;
          auVar31._0_4_ = fVar60 * local_ae0._0_4_;
          auVar31._8_4_ = fVar63 * local_ae0._8_4_;
          auVar31._12_4_ = fVar64 * local_ae0._12_4_;
          auVar31._16_4_ = fVar72 * 0.0;
          auVar31._20_4_ = fVar73 * 0.0;
          auVar31._24_4_ = fVar74 * 0.0;
          auVar31._28_4_ = fStack_9a4;
          auVar47 = vminps_avx(auVar31,auVar77);
          auVar49 = vsubps_avx(auVar77,auVar66);
          auVar11 = vsubps_avx(auVar77,auVar47);
          local_9e0 = vblendvps_avx(auVar47,auVar49,local_ba0);
          local_a00 = vblendvps_avx(auVar66,auVar11,local_ba0);
          fVar72 = local_bc0._0_4_;
          local_9a0._0_4_ = auVar19._0_4_ * fVar72;
          fVar73 = local_bc0._4_4_;
          local_9a0._4_4_ = auVar19._4_4_ * fVar73;
          fVar74 = local_bc0._8_4_;
          local_9a0._8_4_ = auVar19._8_4_ * fVar74;
          fVar60 = local_bc0._12_4_;
          local_9a0._12_4_ = auVar19._12_4_ * fVar60;
          fVar62 = local_bc0._16_4_;
          local_9a0._16_4_ = fVar62 * 0.0;
          fVar63 = local_bc0._20_4_;
          local_9a0._20_4_ = fVar63 * 0.0;
          fVar64 = local_bc0._24_4_;
          local_9a0._24_4_ = fVar64 * 0.0;
          local_9a0._28_4_ = 0;
          local_980._0_4_ = fVar72 * auVar20._0_4_;
          local_980._4_4_ = fVar73 * auVar20._4_4_;
          local_980._8_4_ = fVar74 * auVar20._8_4_;
          local_980._12_4_ = fVar60 * auVar20._12_4_;
          local_980._16_4_ = fVar62 * 0.0;
          local_980._20_4_ = fVar63 * 0.0;
          local_980._24_4_ = fVar64 * 0.0;
          local_980._28_4_ = 0;
          local_960._0_4_ = fVar72 * fVar2;
          local_960._4_4_ = fVar73 * fVar3;
          local_960._8_4_ = fVar74 * fVar9;
          local_960._12_4_ = fVar60 * fVar10;
          local_960._16_4_ = fVar62 * 0.0;
          local_960._20_4_ = fVar63 * 0.0;
          local_960._24_4_ = fVar64 * 0.0;
          local_960._28_4_ = 0;
          auVar46 = vpsllw_avx(auVar46,0xf);
          auVar46 = vpacksswb_avx(auVar46,auVar46);
          uVar40 = (ulong)(byte)(SUB161(auVar46 >> 7,0) & 1 | (SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                                 (SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                                 (SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                                 (SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                                 (SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                                 (SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                                SUB161(auVar46 >> 0x3f,0) << 7);
          do {
            local_c80 = auVar86._0_16_;
            uVar16 = 0;
            for (uVar38 = uVar40; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
              uVar16 = uVar16 + 1;
            }
            uVar39 = *(uint *)((long)&local_b20 + uVar16 * 4);
            pGVar7 = (pSVar6->geometries).items[uVar39].ptr;
            if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_c00 = auVar54._0_32_;
                uVar38 = (ulong)(uint)((int)uVar16 * 4);
                uVar4 = *(undefined4 *)(local_a00 + uVar38);
                local_8c0._4_4_ = uVar4;
                local_8c0._0_4_ = uVar4;
                local_8c0._8_4_ = uVar4;
                local_8c0._12_4_ = uVar4;
                local_8c0._16_4_ = uVar4;
                local_8c0._20_4_ = uVar4;
                local_8c0._24_4_ = uVar4;
                local_8c0._28_4_ = uVar4;
                local_8a0 = *(undefined4 *)(local_9e0 + uVar38);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)((long)local_9c0 + uVar38);
                local_cd0.context = context->user;
                uVar4 = *(undefined4 *)((long)&local_b40 + uVar38);
                local_880._4_4_ = uVar4;
                local_880._0_4_ = uVar4;
                local_880._8_4_ = uVar4;
                local_880._12_4_ = uVar4;
                local_880._16_4_ = uVar4;
                local_880._20_4_ = uVar4;
                local_880._24_4_ = uVar4;
                local_880._28_4_ = uVar4;
                uVar4 = *(undefined4 *)(local_9a0 + uVar38);
                uVar5 = *(undefined4 *)(local_980 + uVar38);
                local_900._4_4_ = uVar5;
                local_900._0_4_ = uVar5;
                local_900._8_4_ = uVar5;
                local_900._12_4_ = uVar5;
                local_900._16_4_ = uVar5;
                local_900._20_4_ = uVar5;
                local_900._24_4_ = uVar5;
                local_900._28_4_ = uVar5;
                uVar5 = *(undefined4 *)(local_960 + uVar38);
                local_8e0._4_4_ = uVar5;
                local_8e0._0_4_ = uVar5;
                local_8e0._8_4_ = uVar5;
                local_8e0._12_4_ = uVar5;
                local_8e0._16_4_ = uVar5;
                local_8e0._20_4_ = uVar5;
                local_8e0._24_4_ = uVar5;
                local_8e0._28_4_ = uVar5;
                local_860._4_4_ = uVar39;
                local_860._0_4_ = uVar39;
                local_860._8_4_ = uVar39;
                local_860._12_4_ = uVar39;
                local_860._16_4_ = uVar39;
                local_860._20_4_ = uVar39;
                local_860._24_4_ = uVar39;
                local_860._28_4_ = uVar39;
                local_920[0] = (RTCHitN)(char)uVar4;
                local_920[1] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_920[2] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_920[3] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_920[4] = (RTCHitN)(char)uVar4;
                local_920[5] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_920[6] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_920[7] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_920[8] = (RTCHitN)(char)uVar4;
                local_920[9] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_920[10] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_920[0xb] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_920[0xc] = (RTCHitN)(char)uVar4;
                local_920[0xd] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_920[0xe] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_920[0xf] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_920[0x10] = (RTCHitN)(char)uVar4;
                local_920[0x11] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_920[0x12] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_920[0x13] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_920[0x14] = (RTCHitN)(char)uVar4;
                local_920[0x15] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_920[0x16] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_920[0x17] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_920[0x18] = (RTCHitN)(char)uVar4;
                local_920[0x19] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_920[0x1a] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_920[0x1b] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_920[0x1c] = (RTCHitN)(char)uVar4;
                local_920[0x1d] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_920[0x1e] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_920[0x1f] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                uStack_89c = local_8a0;
                uStack_898 = local_8a0;
                uStack_894 = local_8a0;
                uStack_890 = local_8a0;
                uStack_88c = local_8a0;
                uStack_888 = local_8a0;
                uStack_884 = local_8a0;
                vpcmpeqd_avx2(local_8c0,local_8c0);
                uStack_83c = (local_cd0.context)->instID[0];
                local_840 = uStack_83c;
                uStack_838 = uStack_83c;
                uStack_834 = uStack_83c;
                uStack_830 = uStack_83c;
                uStack_82c = uStack_83c;
                uStack_828 = uStack_83c;
                uStack_824 = uStack_83c;
                uStack_81c = (local_cd0.context)->instPrimID[0];
                local_820 = uStack_81c;
                uStack_818 = uStack_81c;
                uStack_814 = uStack_81c;
                uStack_810 = uStack_81c;
                uStack_80c = uStack_81c;
                uStack_808 = uStack_81c;
                uStack_804 = uStack_81c;
                local_ca0 = local_be0;
                local_cd0.valid = (int *)local_ca0;
                local_cd0.geometryUserPtr = pGVar7->userPtr;
                local_cd0.hit = local_920;
                local_cd0.N = 8;
                local_cd0.ray = (RTCRayN *)ray;
                if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar7->occlusionFilterN)(&local_cd0);
                }
                auVar47 = vpcmpeqd_avx2(local_ca0,_DAT_01f7b000);
                auVar66 = _DAT_01f7b020 & ~auVar47;
                if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar66 >> 0x7f,0) == '\0') &&
                      (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar66 >> 0xbf,0) == '\0') &&
                    (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar66[0x1f]) {
                  auVar47 = auVar47 ^ _DAT_01f7b020;
                }
                else {
                  p_Var8 = context->args->filter;
                  if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var8)(&local_cd0);
                  }
                  auVar66 = vpcmpeqd_avx2(local_ca0,_DAT_01f7b000);
                  auVar47 = auVar66 ^ _DAT_01f7b020;
                  auVar52._8_4_ = 0xff800000;
                  auVar52._0_8_ = 0xff800000ff800000;
                  auVar52._12_4_ = 0xff800000;
                  auVar52._16_4_ = 0xff800000;
                  auVar52._20_4_ = 0xff800000;
                  auVar52._24_4_ = 0xff800000;
                  auVar52._28_4_ = 0xff800000;
                  auVar66 = vblendvps_avx(auVar52,*(undefined1 (*) [32])(local_cd0.ray + 0x100),
                                          auVar66);
                  *(undefined1 (*) [32])(local_cd0.ray + 0x100) = auVar66;
                }
                if ((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar47 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar47 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar47 >> 0x7f,0) == '\0') &&
                      (auVar47 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar47 >> 0xbf,0) == '\0') &&
                    (auVar47 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar47[0x1f]) {
                  auVar54 = ZEXT3264(local_c00);
                  *(int *)(ray + k * 4 + 0x100) = local_c00._0_4_;
                  auVar86 = ZEXT1664(local_c80);
                  goto LAB_015f8a8c;
                }
              }
              *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
              goto LAB_015f8b7e;
            }
LAB_015f8a8c:
            uVar40 = uVar40 ^ 1L << (uVar16 & 0x3f);
          } while (uVar40 != 0);
        }
      }
      auVar55 = ZEXT1664(local_c10);
      auVar57 = ZEXT1664(local_c20);
      auVar59 = ZEXT1664(local_c30);
      auVar61 = ZEXT1664(local_c40);
      auVar54 = ZEXT1664(local_c50);
      auVar67 = ZEXT1664(local_c60);
      auVar68 = ZEXT1664(local_c70);
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }